

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

mp_int * ssh_rsakex_decrypt(RSAKey *rsa,ssh_hashalg *h,ptrlen ciphertext)

{
  size_t sVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  mp_int *pmVar7;
  mp_int *x;
  char *ptr;
  ulong uVar8;
  long lVar9;
  uint datalen;
  ulong uVar10;
  char *seed;
  BinarySource src [1];
  uchar labelhash [64];
  
  sVar1 = h->hlen;
  sVar5 = mp_get_nbits(rsa->modulus);
  uVar6 = sVar5 + 7 >> 3;
  iVar3 = (int)uVar6;
  uVar8 = 0;
  if ((long)iVar3 != ciphertext.len) {
    return (mp_int *)0x0;
  }
  lVar9 = uVar6 << 0x20;
  pmVar7 = mp_from_bytes_be(ciphertext);
  x = rsa_privkey_op(pmVar7,rsa);
  ptr = (char *)safemalloc(ciphertext.len,1,0);
  uVar10 = 0;
  if (0 < iVar3) {
    uVar10 = uVar6 & 0xffffffff;
  }
  for (; lVar9 = lVar9 + -0x100000000, uVar10 != uVar8; uVar8 = uVar8 + 1) {
    uVar2 = mp_get_byte(x,lVar9 >> 0x20);
    ptr[uVar8] = uVar2;
  }
  mp_free(pmVar7);
  mp_free(x);
  datalen = (uint)sVar1;
  uVar8 = (ulong)(int)datalen;
  seed = ptr + uVar8 + 1;
  oaep_mask(h,seed,~datalen + iVar3,ptr + 1,datalen);
  oaep_mask(h,ptr + 1,datalen,seed,~datalen + iVar3);
  if (*ptr == '\0') {
    if (0x40 < uVar8) {
      __assert_fail("HLEN <= lenof(labelhash)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                    ,0x43e,"mp_int *ssh_rsakex_decrypt(RSAKey *, const ssh_hashalg *, ptrlen)");
    }
    hash_simple(h,(ptrlen)ZEXT816(0x136ab3),labelhash);
    iVar4 = bcmp(seed,labelhash,uVar8);
    if (iVar4 == 0) {
      uVar8 = (ulong)(int)(datalen * 2 + 1);
      do {
        if ((long)iVar3 <= (long)uVar8) {
LAB_0012dc39:
          src[0].data = ptr + (int)uVar8;
          src[0].len = (size_t)(iVar3 - (int)uVar8);
          src[0].binarysource_ = src;
          src[0].pos = 0;
          src[0].err = BSE_NO_ERROR;
          pmVar7 = BinarySource_get_mp_ssh2(src[0].binarysource_);
          safefree(ptr);
          if (((src[0].binarysource_)->err == BSE_NO_ERROR) &&
             ((src[0].binarysource_)->len == (src[0].binarysource_)->pos)) {
            return pmVar7;
          }
          mp_free(pmVar7);
          return (mp_int *)0x0;
        }
        if (ptr[uVar8] != '\0') {
          if (ptr[uVar8] != '\x01') break;
          uVar8 = (ulong)((int)uVar8 + 1);
          goto LAB_0012dc39;
        }
        uVar8 = uVar8 + 1;
      } while( true );
    }
  }
  safefree(ptr);
  return (mp_int *)0x0;
}

Assistant:

mp_int *ssh_rsakex_decrypt(
    RSAKey *rsa, const ssh_hashalg *h, ptrlen ciphertext)
{
    mp_int *b1, *b2;
    int outlen, i;
    unsigned char *out;
    unsigned char labelhash[64];
    BinarySource src[1];
    const int HLEN = h->hlen;

    /*
     * Decryption side of the RSA key exchange operation.
     */

    /* The length of the encrypted data should be exactly the length
     * in octets of the RSA modulus.. */
    outlen = (7 + mp_get_nbits(rsa->modulus)) / 8;
    if (ciphertext.len != outlen)
        return NULL;

    /* Do the RSA decryption, and extract the result into a byte array. */
    b1 = mp_from_bytes_be(ciphertext);
    b2 = rsa_privkey_op(b1, rsa);
    out = snewn(outlen, unsigned char);
    for (i = 0; i < outlen; i++)
        out[i] = mp_get_byte(b2, outlen-1-i);
    mp_free(b1);
    mp_free(b2);

    /* Do the OAEP masking operations, in the reverse order from encryption */
    oaep_mask(h, out+HLEN+1, outlen-HLEN-1, out+1, HLEN);
    oaep_mask(h, out+1, HLEN, out+HLEN+1, outlen-HLEN-1);

    /* Check the leading byte is zero. */
    if (out[0] != 0) {
        sfree(out);
        return NULL;
    }
    /* Check the label hash at position 1+HLEN */
    assert(HLEN <= lenof(labelhash));
    hash_simple(h, PTRLEN_LITERAL(""), labelhash);
    if (memcmp(out + HLEN + 1, labelhash, HLEN)) {
        sfree(out);
        return NULL;
    }
    /* Expect zero bytes followed by a 1 byte */
    for (i = 1 + 2 * HLEN; i < outlen; i++) {
        if (out[i] == 1) {
            i++;  /* skip over the 1 byte */
            break;
        } else if (out[i] != 0) {
            sfree(out);
            return NULL;
        }
    }
    /* And what's left is the input message data, which should be
     * encoded as an ordinary SSH-2 mpint. */
    BinarySource_BARE_INIT(src, out + i, outlen - i);
    b1 = get_mp_ssh2(src);
    sfree(out);
    if (get_err(src) || get_avail(src) != 0) {
        mp_free(b1);
        return NULL;
    }

    /* Success! */
    return b1;
}